

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins.cpp
# Opt level: O3

Coin * AccessByTxid(CCoinsViewCache *view,Txid *txid)

{
  iterator iVar1;
  Coin *pCVar2;
  long in_FS_OFFSET;
  COutPoint local_48;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ =
       *(undefined8 *)(txid->m_wrapped).super_base_blob<256U>.m_data._M_elems;
  local_48.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ =
       *(undefined8 *)((txid->m_wrapped).super_base_blob<256U>.m_data._M_elems + 8);
  local_48.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ =
       *(undefined8 *)((txid->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x10);
  local_48.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ =
       *(undefined8 *)((txid->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x18);
  local_48.n = 0;
  if (MAX_OUTPUTS_PER_BLOCK == 0) {
    pCVar2 = &coinEmpty;
  }
  else {
    do {
      iVar1 = CCoinsViewCache::FetchCoin(view,&local_48);
      pCVar2 = (Coin *)((long)iVar1.
                              super__Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>
                              ._M_cur + 0x48);
      if (iVar1.super__Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>.
          _M_cur == (__node_type *)0x0) {
        pCVar2 = &coinEmpty;
      }
      if ((pCVar2->out).nValue != -1) goto LAB_00687477;
      local_48.n = local_48.n + 1;
    } while (local_48.n < MAX_OUTPUTS_PER_BLOCK);
    pCVar2 = &coinEmpty;
  }
LAB_00687477:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return pCVar2;
}

Assistant:

const Coin& AccessByTxid(const CCoinsViewCache& view, const Txid& txid)
{
    COutPoint iter(txid, 0);
    while (iter.n < MAX_OUTPUTS_PER_BLOCK) {
        const Coin& alternate = view.AccessCoin(iter);
        if (!alternate.IsSpent()) return alternate;
        ++iter.n;
    }
    return coinEmpty;
}